

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O1

Slice __thiscall leveldb::anon_unknown_3::DBIter::key(DBIter *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong extraout_RDX;
  size_type sVar4;
  long in_FS_OFFSET;
  Slice SVar5;
  pointer pcVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->valid_ == false) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0x41,"virtual Slice leveldb::(anonymous namespace)::DBIter::key() const");
  }
  if (this->direction_ == kForward) {
    iVar2 = (*this->iter_->_vptr_Iterator[8])();
    pcVar3 = (pointer)CONCAT44(extraout_var,iVar2);
    if (extraout_RDX < 8) {
      __assert_fail("internal_key.size() >= 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                    ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
    }
    sVar4 = extraout_RDX - 8;
  }
  else {
    pcVar3 = (this->saved_key_)._M_dataplus._M_p;
    sVar4 = (this->saved_key_)._M_string_length;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar5.size_ = sVar4;
    SVar5.data_ = pcVar3;
    return SVar5;
  }
  __stack_chk_fail();
}

Assistant:

Slice key() const override {
    assert(valid_);
    return (direction_ == kForward) ? ExtractUserKey(iter_->key()) : saved_key_;
  }